

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_>::ForcePrepareIntPtIndices
          (TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>_> *this)

{
  IntruleType *pIVar1;
  int iVar2;
  uint uVar3;
  TPZMaterial *pTVar4;
  long *plVar5;
  ostream *poVar6;
  ulong uVar7;
  IntruleType *pIVar8;
  ulong uVar9;
  
  pTVar4 = TPZCompEl::Material((TPZCompEl *)this);
  if ((pTVar4 != (TPZMaterial *)0x0) &&
     (plVar5 = (long *)__dynamic_cast(pTVar4,&TPZMaterial::typeinfo,&TPZMatWithMemBase::typeinfo,
                                      0xfffffffffffffffe), plVar5 != (long *)0x0)) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                   super_TPZIntelGen<pzshape::TPZShapePoint>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x180))(this);
    if (iVar2 != 0) {
      pIVar1 = (IntruleType *)
               (this->super_TPZCompElH1<pzshape::TPZShapePoint>).
               super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
               super_TPZInterpolationSpace.super_TPZCompEl.fIntegrationRule;
      pIVar8 = &(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                super_TPZIntelGen<pzshape::TPZShapePoint>.fIntRule;
      if (pIVar1 != (IntruleType *)0x0) {
        pIVar8 = pIVar1;
      }
      uVar3 = (*(pIVar8->super_TPZIntPoints)._vptr_TPZIntPoints[3])();
      TPZManVector<long,_128>::Resize
                (&(this->fIntPtIndices).super_TPZManVector<long,_128>,(long)(int)uVar3);
      if (((int)uVar3 < 1) || (gSinglePointMemory == false)) {
        uVar9 = 0;
        uVar7 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar7 = uVar9;
        }
        for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5,0xffffffff);
          (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore[uVar9] =
               (long)iVar2;
        }
      }
      else {
        iVar2 = (**(code **)(*plVar5 + 0x58))(plVar5);
        plVar5 = (this->fIntPtIndices).super_TPZManVector<long,_128>.super_TPZVec<long>.fStore;
        for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
          plVar5[uVar7] = (long)iVar2;
        }
      }
    }
    return;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar6 = std::operator<<(poVar6,
                           "virtual void TPZCompElWithMem<TPZCompElH1<pzshape::TPZShapePoint>>::ForcePrepareIntPtIndices() [TBASE = TPZCompElH1<pzshape::TPZShapePoint>]"
                          );
  std::operator<<(poVar6," this->Material() == NULL\n");
  return;
}

Assistant:

inline void TPZCompElWithMem<TBASE>::ForcePrepareIntPtIndices() {
    
    TPZMaterial * material = TBASE::Material();
    auto * matWithMem =
        dynamic_cast<TPZMatWithMemBase *>(material);
    if(!material || !matWithMem){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        return;
    }
    
    if (this->NumberOfCompElementsInsideThisCompEl() == 0) {
        // This is suposed to happen if in the constructor of a multiphysics element. The CompEl vector is only initialized after the autobuild
        return;
    }
    
    const TPZIntPoints &intrule = TBASE::GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    
    fIntPtIndices.Resize(intrulepoints);
    
    if(gSinglePointMemory && intrulepoints > 0)
    {
        int64_t point_index = matWithMem->PushMemItem();
#ifdef PZDEBUG
        if(point_index < 0)
        {
            std::cout << __PRETTY_FUNCTION__ << " material has no memory interface\n";
        }
#endif
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = point_index;
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
    }
    else
    {
        for(int int_ind = 0; int_ind < intrulepoints; ++int_ind){
            fIntPtIndices[int_ind] = matWithMem->PushMemItem();
            // Pushing a new entry in the material memory
        } //Loop over integratin points generating a reference vector of memory
          //entries in the related pzmatwithmem for further use.
    }
    
}